

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void CombinationKeygenRecurse<unsigned_long,block16>
               (block16 *key,int len,int maxlen,block16 *blocks,int blockcount,pfHash hash,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  undefined8 uVar1;
  long lVar2;
  unsigned_long h;
  value_type_conflict3 local_38;
  
  if (len != maxlen) {
    for (lVar2 = 0; (ulong)(uint)(~(blockcount >> 0x1f) & blockcount) << 4 != lVar2;
        lVar2 = lVar2 + 0x10) {
      uVar1 = *(undefined8 *)(blocks->c + lVar2 + 8);
      *(undefined8 *)key[len].c = *(undefined8 *)(blocks->c + lVar2);
      *(undefined8 *)(key[len].c + 8) = uVar1;
      (*hash)(key,(len + 1) * 0x10,0,&local_38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(hashes,&local_38);
      CombinationKeygenRecurse<unsigned_long,block16>
                (key,len + 1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}